

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O1

unsigned_long xmlChildElementCount(xmlNodePtr parent)

{
  unsigned_long uVar1;
  _xmlNode *p_Var2;
  
  if (parent == (xmlNodePtr)0x0) {
    return 0;
  }
  uVar1 = 0;
  if ((parent->type < XML_DTD_NODE) &&
     ((0x2a42U >> (parent->type & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) != 0)) {
    p_Var2 = parent->children;
    if (p_Var2 == (_xmlNode *)0x0) {
      return 0;
    }
    uVar1 = 0;
    do {
      uVar1 = uVar1 + (p_Var2->type == XML_ELEMENT_NODE);
      p_Var2 = p_Var2->next;
    } while (p_Var2 != (_xmlNode *)0x0);
  }
  return uVar1;
}

Assistant:

unsigned long
xmlChildElementCount(xmlNodePtr parent) {
    unsigned long ret = 0;
    xmlNodePtr cur = NULL;

    if (parent == NULL)
        return(0);
    switch (parent->type) {
        case XML_ELEMENT_NODE:
        case XML_ENTITY_NODE:
        case XML_DOCUMENT_NODE:
        case XML_DOCUMENT_FRAG_NODE:
        case XML_HTML_DOCUMENT_NODE:
            cur = parent->children;
            break;
        default:
            return(0);
    }
    while (cur != NULL) {
        if (cur->type == XML_ELEMENT_NODE)
            ret++;
        cur = cur->next;
    }
    return(ret);
}